

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# float_vector.c
# Opt level: O1

exr_result_t exr_attr_float_vector_init(exr_context_t ctxt,exr_attr_float_vector_t *fv,int32_t nent)

{
  exr_result_t eVar1;
  float *pfVar2;
  char *pcVar3;
  _func_exr_result_t_exr_const_context_t_exr_result_t_char_ptr_varargs *UNRECOVERED_JUMPTABLE;
  
  if (ctxt == (exr_context_t)0x0) {
    return 2;
  }
  if (fv == (exr_attr_float_vector_t *)0x0) {
    eVar1 = (*ctxt->report_error)(ctxt,3,"Invalid reference to float vector object to initialize");
    return eVar1;
  }
  fv->length = 0;
  fv->alloc_size = 0;
  fv->arr = (float *)0x0;
  if (nent < 0) {
    UNRECOVERED_JUMPTABLE = ctxt->print_error;
    pcVar3 = "Received request to allocate negative sized float vector (%d entries)";
  }
  else {
    if ((ulong)((long)nent << 2) >> 0x1f == 0) {
      if (nent == 0) {
        return 0;
      }
      pfVar2 = (float *)(*ctxt->alloc_fn)((long)nent << 2);
      fv->arr = pfVar2;
      if (pfVar2 != (float *)0x0) {
        fv->length = nent;
        fv->alloc_size = nent;
        return 0;
      }
      eVar1 = (*ctxt->standard_error)(ctxt,1);
      return eVar1;
    }
    UNRECOVERED_JUMPTABLE = ctxt->print_error;
    pcVar3 = "Invalid too large size for float vector (%d entries)";
  }
  eVar1 = (*UNRECOVERED_JUMPTABLE)(ctxt,3,pcVar3,(ulong)(uint)nent,UNRECOVERED_JUMPTABLE);
  return eVar1;
}

Assistant:

exr_result_t
exr_attr_float_vector_init (
    exr_context_t ctxt, exr_attr_float_vector_t* fv, int32_t nent)
{
    exr_attr_float_vector_t nil   = {0};
    size_t                  bytes = (size_t) (nent) * sizeof (float);

    if (!ctxt) return EXR_ERR_MISSING_CONTEXT_ARG;

    if (!fv)
        return ctxt->report_error (
            ctxt,
            EXR_ERR_INVALID_ARGUMENT,
            "Invalid reference to float vector object to initialize");

    *fv = nil;

    if (nent < 0)
        return ctxt->print_error (
            ctxt,
            EXR_ERR_INVALID_ARGUMENT,
            "Received request to allocate negative sized float vector (%d entries)",
            nent);

    if (bytes > (size_t) INT32_MAX)
    {
        return ctxt->print_error (
            ctxt,
            EXR_ERR_INVALID_ARGUMENT,
            "Invalid too large size for float vector (%d entries)",
            nent);
    }
    else if (bytes > 0)
    {
        fv->arr = (float*) ctxt->alloc_fn (bytes);
        if (fv->arr == NULL)
            return ctxt->standard_error (ctxt, EXR_ERR_OUT_OF_MEMORY);
        fv->length     = nent;
        fv->alloc_size = nent;
    }

    return EXR_ERR_SUCCESS;
}